

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  byte *pbVar3;
  startElementSAXFunc p_Var4;
  uint uVar5;
  xmlChar *pxVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *str2;
  xmlChar **ppxVar9;
  xmlParserInputPtr pxVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  xmlChar **ppxVar16;
  xmlChar *attvalue;
  xmlChar *local_40;
  ulong local_38;
  
  pxVar10 = ctxt->input;
  pxVar8 = pxVar10->cur;
  if (*pxVar8 == '<') {
    ppxVar16 = ctxt->atts;
    local_38 = (ulong)(uint)ctxt->maxatts;
    pxVar10->col = pxVar10->col + 1;
    pxVar10->cur = pxVar8 + 1;
    if (pxVar8[1] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar8 = xmlParseName(ctxt);
    if (pxVar8 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      pxVar10 = ctxt->input;
      if (((pxVar10->flags & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      iVar15 = 0;
      do {
        pbVar3 = ctxt->input->cur;
        bVar1 = *pbVar3;
        if (bVar1 == 0x2f) {
          if (pbVar3[1] == 0x3e) {
LAB_0013c4cb:
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var4 = ctxt->sax->startElement, p_Var4 != (startElementSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              if (iVar15 < 1) {
                (*p_Var4)(ctxt->userData,pxVar8,(xmlChar **)0x0);
                return pxVar8;
              }
              (*p_Var4)(ctxt->userData,pxVar8,ppxVar16);
            }
            if (1 < iVar15 && ppxVar16 != (xmlChar **)0x0) {
              lVar14 = 1;
              do {
                if (ppxVar16[lVar14] != (xmlChar *)0x0) {
                  (*xmlFree)(ppxVar16[lVar14]);
                }
                lVar14 = lVar14 + 2;
              } while ((int)lVar14 < iVar15);
              return pxVar8;
            }
            return pxVar8;
          }
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_0013c4cb;
        if ((1 < ctxt->disableSAX) ||
           (str2 = xmlParseAttribute(ctxt,&local_40), pxVar6 = local_40, str2 == (xmlChar *)0x0))
        goto LAB_0013c4cb;
        if (local_40 != (xmlChar *)0x0) {
          if (0 < iVar15) {
            lVar14 = 0;
            do {
              iVar7 = xmlStrEqual(ppxVar16[lVar14],str2);
              if (iVar7 != 0) {
                xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_ATTRIBUTE_REDEFINED,
                           XML_ERR_FATAL,str2,(xmlChar *)0x0,(xmlChar *)0x0,0,
                           "Attribute %s redefined\n",str2);
                goto LAB_0013c3d9;
              }
              lVar14 = lVar14 + 2;
            } while ((int)lVar14 < iVar15);
          }
          uVar11 = (uint)local_38;
          ppxVar9 = ppxVar16;
          if ((int)uVar11 < iVar15 + 4) {
            if ((int)uVar11 < 1) {
              uVar13 = 0xb;
LAB_0013c377:
              ppxVar9 = (xmlChar **)(*xmlRealloc)(ppxVar16,uVar13 << 4);
              if (ppxVar9 != (xmlChar **)0x0) {
                uVar11 = (int)uVar13 * 2;
                ctxt->atts = ppxVar9;
                ctxt->maxatts = uVar11;
                local_38 = (ulong)uVar11;
                goto LAB_0013c3a8;
              }
            }
            else if (uVar11 < 100000000) {
              uVar12 = uVar11 + 1 >> 1;
              uVar5 = uVar12 + uVar11;
              if (100000000 - uVar12 < uVar11) {
                uVar5 = 100000000;
              }
              uVar13 = (ulong)uVar5;
              goto LAB_0013c377;
            }
            xmlCtxtErrMemory(ctxt);
LAB_0013c3d9:
            (*xmlFree)(pxVar6);
          }
          else {
LAB_0013c3a8:
            ppxVar9[iVar15] = str2;
            ppxVar9[(long)iVar15 + 1] = local_40;
            ppxVar9[(long)iVar15 + 2] = (xmlChar *)0x0;
            (ppxVar9 + (long)iVar15 + 2)[1] = (xmlChar *)0x0;
            local_40 = (xmlChar *)0x0;
            ppxVar16 = ppxVar9;
            iVar15 = iVar15 + 2;
          }
        }
        pxVar10 = ctxt->input;
        if (((pxVar10->flags & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar10 = ctxt->input;
        }
        xVar2 = *pxVar10->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar10->cur[1];
        }
        if (xVar2 == '>') goto LAB_0013c4cb;
        iVar7 = xmlSkipBlankChars(ctxt);
        if (iVar7 == 0) {
          xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_SPACE_REQUIRED,XML_ERR_FATAL,
                     (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                     "attributes construct error\n");
        }
        pxVar10 = ctxt->input;
        uVar11 = pxVar10->flags;
        if ((uVar11 & 0x40) == 0) {
          xmlParserShrink(ctxt);
          pxVar10 = ctxt->input;
          uVar11 = pxVar10->flags;
        }
        if (((uVar11 & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      } while( true );
    }
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_NAME_REQUIRED,XML_ERR_FATAL,
               (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
               "xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (PARSER_STOPPED(ctxt) == 0)) {
	attname = xmlParseAttribute(ctxt, &attvalue);
        if (attname == NULL)
	    break;
        if (attvalue != NULL) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (nbatts + 4 > maxatts) {
	        const xmlChar **n;
                int newSize;

                newSize = xmlGrowCapacity(maxatts, sizeof(n[0]) * 2,
                                          11, XML_MAX_ATTRS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                if (newSize < 2)
                    newSize = 2;
#endif
	        n = xmlRealloc(atts, newSize * sizeof(n[0]) * 2);
		if (n == NULL) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
		atts = n;
                maxatts = newSize * 2;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }

	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;

            attvalue = NULL;
	}

failed:

        if (attvalue != NULL)
            xmlFree(attvalue);

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}